

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O2

sysbvm_tuple_t sysbvm_byteStream_asByteArray(sysbvm_context_t *context,sysbvm_tuple_t byteStream)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t size;
  
  if ((byteStream & 0xf) == 0 && byteStream != 0) {
    uVar1 = *(ulong *)(byteStream + 0x10);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      size = (long)uVar1 >> 4;
    }
    else {
      size = *(sysbvm_tuple_t *)(uVar1 + 0x10);
    }
    sVar2 = sysbvm_byteArray_create(context,size);
    memcpy((void *)(sVar2 + 0x10),(void *)(*(long *)(byteStream + 0x18) + 0x10),size);
  }
  else {
    sVar2 = 0;
  }
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_byteStream_asByteArray(sysbvm_context_t *context, sysbvm_tuple_t byteStream)
{
    if(!sysbvm_tuple_isNonNullPointer(byteStream))
        return SYSBVM_NULL_TUPLE;

    sysbvm_byteStream_t *byteStreamObject = (sysbvm_byteStream_t*)byteStream;
    size_t size = sysbvm_tuple_size_decode(byteStreamObject->size);
    sysbvm_object_tuple_t *result = (sysbvm_object_tuple_t*)sysbvm_byteArray_create(context, size);
    sysbvm_object_tuple_t *storage = (sysbvm_object_tuple_t*)byteStreamObject->storage;
    memcpy(result->bytes, storage->bytes, size);
    return (sysbvm_tuple_t)result;
}